

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O0

void mp::
     WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>
               *cfc,ItemNamer *vnam)

{
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  bool bVar1;
  BasicStringRef<char> *in_RDX;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_RSI;
  char *in_stack_ffffffffffffffa8;
  BasicWriter<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  ItemNamer *in_stack_ffffffffffffffe0;
  BasicStringRef<char> *pBVar2;
  
  bVar1 = FunctionalConstraint::HasResultVar((FunctionalConstraint *)in_RSI);
  if (bVar1) {
    pBVar2 = in_RDX;
    FunctionalConstraint::GetResultVar((FunctionalConstraint *)in_RSI);
    ItemNamer::at((ItemNamer *)cfc,(size_t)vnam);
    fmt::BasicStringRef<char>::BasicStringRef(in_RDX,in_stack_ffffffffffffffa8);
    value.size_ = (size_t)in_stack_ffffffffffffffe0;
    value.data_ = in_stack_ffffffffffffffd8;
    fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffd0,value);
    fmt::BasicStringRef<char>::BasicStringRef(in_RDX,in_stack_ffffffffffffffa8);
    value_00.size_ = (size_t)in_stack_ffffffffffffffe0;
    value_00.data_ = in_stack_ffffffffffffffd8;
    fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffd0,value_00);
    in_RDX = pBVar2;
  }
  WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::MaxId>
            (in_RSI,(CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::MaxId>
                     *)in_RDX,in_stack_ffffffffffffffe0);
  return;
}

Assistant:

inline void WriteModelItem(
    Writer& wrt,
    const CustomFunctionalConstraint<A,P,N,I>& cfc,
    ItemNamer& vnam) {
  if (cfc.HasResultVar())   // really functional
    wrt << vnam.at(cfc.GetResultVar()) << " == ";
  WriteModelItem(
      wrt, (const CustomConstraintData<A, P, I>&)cfc, vnam);
}